

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)> * __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::range<0ul,char_const(&)[4],char_const(&)[4]>
          (TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)>
           *__return_storage_ptr__,
          Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
          *this,char (*params) [4],char (*params_1) [4])

{
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table;
  
  table.size_ = *(long *)(this + 8) - (long)*(StringPtr **)this >> 5;
  table.ptr = *(StringPtr **)this;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  range<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4],char_const(&)[4]>
            (&__return_storage_ptr__->inner,
             (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)(this + 0x20),table,params,
             params_1);
  (__return_storage_ptr__->super_TableMapping<kj::TreeMap<kj::String,_int>::Entry>).table =
       *(StringPtr **)this;
  return __return_storage_ptr__;
}

Assistant:

auto Table<Row, Indexes...>::range(Params&&... params) {
  auto inner = get<index>(indexes).range(rows.asPtr(), kj::fwd<Params>(params)...);
  return _::TableIterable<Row, decltype(inner)>(kj::mv(inner), rows.begin());
}